

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiWindow *pIVar1;
  float *pfVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (w_full <= 0.0) {
    w_full = CalcItemWidth();
  }
  iVar7 = components + -1;
  fVar12 = (pIVar3->Style).ItemInnerSpacing.x;
  fVar10 = (float)(int)((w_full - fVar12 * (float)iVar7) / (float)components);
  fVar11 = 1.0;
  if (1.0 <= fVar10) {
    fVar11 = fVar10;
  }
  fVar10 = (float)(int)(w_full - (fVar12 + fVar11) * (float)iVar7);
  fVar12 = 1.0;
  if (1.0 <= fVar10) {
    fVar12 = fVar10;
  }
  iVar4 = (pIVar1->DC).ItemWidthStack.Size;
  if (iVar4 == (pIVar1->DC).ItemWidthStack.Capacity) {
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    iVar8 = iVar4 + 1;
    if (iVar4 + 1 < iVar6) {
      iVar8 = iVar6;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pfVar5 = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    pfVar2 = (pIVar1->DC).ItemWidthStack.Data;
    if (pfVar2 != (float *)0x0) {
      memcpy(pfVar5,pfVar2,(long)(pIVar1->DC).ItemWidthStack.Size << 2);
      pfVar2 = (pIVar1->DC).ItemWidthStack.Data;
      if (pfVar2 != (float *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pfVar2,GImAllocatorUserData);
    }
    (pIVar1->DC).ItemWidthStack.Data = pfVar5;
    (pIVar1->DC).ItemWidthStack.Capacity = iVar8;
    iVar4 = (pIVar1->DC).ItemWidthStack.Size;
  }
  else {
    pfVar5 = (pIVar1->DC).ItemWidthStack.Data;
  }
  pfVar5[iVar4] = fVar12;
  uVar9 = (pIVar1->DC).ItemWidthStack.Size + 1;
  (pIVar1->DC).ItemWidthStack.Size = uVar9;
  if (1 < components) {
    do {
      if (uVar9 == (pIVar1->DC).ItemWidthStack.Capacity) {
        if (uVar9 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = (int)uVar9 / 2 + uVar9;
        }
        iVar6 = uVar9 + 1;
        if ((int)(uVar9 + 1) < iVar4) {
          iVar6 = iVar4;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pfVar5 = (float *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
        pfVar2 = (pIVar1->DC).ItemWidthStack.Data;
        if (pfVar2 != (float *)0x0) {
          memcpy(pfVar5,pfVar2,(long)(pIVar1->DC).ItemWidthStack.Size << 2);
          pfVar2 = (pIVar1->DC).ItemWidthStack.Data;
          if (pfVar2 != (float *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pfVar2,GImAllocatorUserData);
        }
        (pIVar1->DC).ItemWidthStack.Data = pfVar5;
        (pIVar1->DC).ItemWidthStack.Capacity = iVar6;
        uVar9 = (pIVar1->DC).ItemWidthStack.Size;
      }
      else {
        pfVar5 = (pIVar1->DC).ItemWidthStack.Data;
      }
      pfVar5[(int)uVar9] = fVar11;
      uVar9 = (pIVar1->DC).ItemWidthStack.Size + 1;
      (pIVar1->DC).ItemWidthStack.Size = uVar9;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  if (0 < (int)uVar9) {
    (pIVar1->DC).ItemWidth = (pIVar1->DC).ItemWidthStack.Data[(ulong)uVar9 - 1];
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<float>::back() [T = float]");
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}